

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufiber.hpp
# Opt level: O1

return_type
boost::asio::async_result<ufiber::yield_token<boost::asio::executor>,void()>::
initiate<boost::asio::detail::initiate_post,ufiber::yield_token<boost::asio::executor>&>
          (initiate_post *op,yield_token<boost::asio::executor> *token)

{
  resumer this;
  impl_base *piVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  promise<> promise;
  completion_handler_type handler;
  int local_3c;
  completion_handler_type local_38;
  anon_class_16_2_08e66f54 local_20;
  
  local_38.promise_._M_t.super___uniq_ptr_impl<void,_ufiber::detail::fiber_context::resumer>._M_t.
  super__Tuple_impl<0UL,_void_*,_ufiber::detail::fiber_context::resumer>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = &local_3c;
  local_3c = 0;
  this.ctx_ = token->ctx_;
  piVar1 = (token->executor_).impl_;
  local_38.promise_._M_t.super___uniq_ptr_impl<void,_ufiber::detail::fiber_context::resumer>._M_t.
  super__Tuple_impl<0UL,_void_*,_ufiber::detail::fiber_context::resumer>.
  super__Tuple_impl<1UL,_ufiber::detail::fiber_context::resumer>.
  super__Head_base<1UL,_ufiber::detail::fiber_context::resumer,_false>._M_head_impl.ctx_ =
       (_Head_base<1UL,_ufiber::detail::fiber_context::resumer,_false>)
       (_Head_base<1UL,_ufiber::detail::fiber_context::resumer,_false>)this.ctx_;
  if (piVar1 == (impl_base *)0x0) {
    local_38.executor_.impl_ = (impl_base *)0x0;
  }
  else {
    iVar2 = (**piVar1->_vptr_impl_base)();
    local_38.executor_.impl_ = (impl_base *)CONCAT44(extraout_var,iVar2);
  }
  local_20.handler = &local_38;
  local_20.op = op;
  ufiber::detail::fiber_context::
  suspend_with<boost::asio::async_result<ufiber::yield_token<boost::asio::executor>,void()>::initiate<boost::asio::detail::initiate_post,ufiber::yield_token<boost::asio::executor>&>(boost::asio::detail::initiate_post&&,ufiber::yield_token<boost::asio::executor>&)::_lambda()_1_>
            (this.ctx_,&local_20);
  if (local_3c == 1) {
    if (local_38.executor_.impl_ != (impl_base *)0x0) {
      (*(local_38.executor_.impl_)->_vptr_impl_base[1])();
    }
    std::unique_ptr<void,_ufiber::detail::fiber_context::resumer>::~unique_ptr(&local_38.promise_);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_0010eb00;
  __cxa_throw(puVar3,&ufiber::broken_promise::typeinfo,std::exception::~exception);
}

Assistant:

static return_type initiate(Op&& op, Token&& token, Ts&&... ts)
    {
        ::ufiber::detail::promise<Args...> promise;
        ::ufiber::detail::fiber_context& ctx =
          ::ufiber::detail::get_fiber(token);
        completion_handler_type handler{&promise, token, ctx};
        ctx.suspend_with([&]() noexcept {
            op(std::move(handler), std::forward<Ts>(ts)...);
        });
        return promise.get_value();
    }